

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database_tmpl_impl.hpp
# Opt level: O0

void __thiscall hiberlite::Database::registerBeanClass<Person>(Database *this)

{
  ModelExtractor *pMVar1;
  shared_res<hiberlite::autoclosed_con> local_50;
  string local_40 [8];
  string classname;
  Database *this_local;
  
  if (this->mx == (ModelExtractor *)0x0) {
    pMVar1 = (ModelExtractor *)operator_new(0xf0);
    ModelExtractor::ModelExtractor(pMVar1);
    this->mx = pMVar1;
  }
  getClassName<Person>();
  pMVar1 = this->mx;
  shared_res<hiberlite::autoclosed_con>::shared_res(&local_50,&this->con);
  ModelExtractor::extractModel<Person>(pMVar1,&local_50);
  shared_res<hiberlite::autoclosed_con>::~shared_res(&local_50);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

inline void Database::registerBeanClass()
{
	if(!mx)
		mx=new ModelExtractor();
	std::string classname=Database::getClassName<C>();

	mx->extractModel<C>(con);
}